

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

prsndef * prsxarg(prscxdef *ctx)

{
  prscxdef *ppVar1;
  prscxdef *in_RDI;
  prscxdef *unaff_retaddr;
  int t;
  prsndef *n;
  tokcxdef *in_stack_00000088;
  char *in_stack_ffffffffffffffc8;
  errcxdef *in_stack_ffffffffffffffd0;
  int t_00;
  int iVar2;
  int iVar3;
  prsbdef *in_stack_fffffffffffffff8;
  
  ppVar1 = in_RDI;
  prs_cmode(in_RDI);
  t_00 = (int)((ulong)ppVar1 >> 0x20);
  ppVar1 = (prscxdef *)prsxbin(unaff_retaddr,in_stack_fffffffffffffff8);
  iVar2 = (in_RDI->prscxtok->tokcxcur).toktyp;
  toknext(in_stack_00000088);
  if (iVar2 != 0x33) {
    if (iVar2 != 0x3f) {
      errsigf(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    }
    iVar3 = iVar2;
    prsxarg(ppVar1);
    ppVar1 = (prscxdef *)
             prsnew2((prscxdef *)CONCAT44(iVar3,iVar2),t_00,(prsndef *)ppVar1,(prsndef *)in_RDI);
  }
  return (prsndef *)ppVar1;
}

Assistant:

static prsndef *prsxarg(prscxdef *ctx)
{
    prsndef *n;
    int      t;
    
    /* arguments are assignments:  just under comma-expressions */
    n = prsxbin(ctx, prs_cmode(ctx) ? &prsb_asi_C : &prsb_asi);
    
    t = ctx->prscxtok->tokcxcur.toktyp;
    toknext(ctx->prscxtok);
    switch(t)
    {
    case TOKTRPAR:
        return(n);
        
    case TOKTCOMMA:
        return(prsnew2(ctx, TOKTRPAR, n, prsxarg(ctx)));
        
    default:
        errsig(ctx->prscxerr, ERR_REQARG);
        NOTREACHEDV(prsndef *);
        return 0;
    }
}